

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallScriptGenerator.cxx
# Opt level: O0

void __thiscall cmInstallScriptGenerator::~cmInstallScriptGenerator(cmInstallScriptGenerator *this)

{
  cmInstallScriptGenerator *this_local;
  
  ~cmInstallScriptGenerator(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

cmInstallScriptGenerator::~cmInstallScriptGenerator() = default;